

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_18d51b::PointerToMemberType::printRight
          (PointerToMemberType *this,OutputStream *s)

{
  bool bVar1;
  StringView R;
  
  bVar1 = Node::hasArray(this->MemberType,s);
  if (!bVar1) {
    bVar1 = Node::hasFunction(this->MemberType,s);
    if (!bVar1) goto LAB_0015132b;
  }
  R.Last = "";
  R.First = ")";
  OutputStream::operator+=(s,R);
LAB_0015132b:
  (*this->MemberType->_vptr_Node[5])(this->MemberType,s);
  return;
}

Assistant:

void printRight(OutputStream &s) const override {
    if (MemberType->hasArray(s) || MemberType->hasFunction(s))
      s += ")";
    MemberType->printRight(s);
  }